

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

ValueType __thiscall ValueType::ToDefiniteAnyNumber(ValueType *this)

{
  Bits BVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  Bits bits;
  
  BVar1 = (this->field_0).bits;
  bits = Number|CanBeTaggedValue;
  if ((BVar1 & (PrimitiveOrObject|Object)) == 0) {
    bits = BVar1 & (Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue) |
           (Number|CanBeTaggedValue);
    if ((BVar1 & (Number|Float)) != 0) {
      bits = BVar1 & (Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue);
    }
  }
  aVar2.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(bits);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar2.field_0;
}

Assistant:

ValueType ValueType::ToDefiniteAnyNumber() const
{
    // Not asserting on expected value type because Conv_Num allows converting values of arbitrary types to number
    if(OneOn(Bits::Object | Bits::PrimitiveOrObject))
        return Verify(Bits::Number | Bits::CanBeTaggedValue);
    Bits numberBits =
        bits &
        (
            Bits::Int |
            Bits::IntCanBeUntagged |
            Bits::IntIsLikelyUntagged |
            Bits::CanBeTaggedValue |
            Bits::Float |
            Bits::Number
        );
    if(!(numberBits & (Bits::Float | Bits::Number)))
        numberBits |= Bits::Number | Bits::CanBeTaggedValue;
    return Verify(numberBits);
}